

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

double __thiscall OpenMD::SquareMatrix3<double>::determinant(SquareMatrix3<double> *this)

{
  double z;
  double y;
  double x;
  SquareMatrix3<double> *this_local;
  
  return (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0] *
         ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1] *
          (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] +
         -((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] *
          (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1])) +
         (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1] *
         ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] *
          (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0] +
         -((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0] *
          (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2])) +
         (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2] *
         ((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0] *
          (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1] +
         -((this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1] *
          (this->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0]));
}

Assistant:

Real determinant() const {
      Real x, y, z;

      x = this->data_[0][0] * (this->data_[1][1] * this->data_[2][2] -
                               this->data_[1][2] * this->data_[2][1]);
      y = this->data_[0][1] * (this->data_[1][2] * this->data_[2][0] -
                               this->data_[1][0] * this->data_[2][2]);
      z = this->data_[0][2] * (this->data_[1][0] * this->data_[2][1] -
                               this->data_[1][1] * this->data_[2][0]);
      return (x + y + z);
    }